

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDVertexPtr vptr,ON_SubDEdge *active_edge,
          ON_SubDFace *active_face)

{
  bool bVar1;
  ON_SubDFace *f;
  anon_union_8_3_7b68a318_for_m_p1 local_64;
  uint local_5c;
  ON_SubDEdgePtr OStack_58;
  int vfi;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_4c;
  uint local_44;
  ON_SubDVertex *pOStack_40;
  int vei;
  ON_SubDVertex *v;
  ON_SubDComponentId local_30;
  ON_SubDFace *local_28;
  ON_SubDFace *active_face_local;
  ON_SubDEdge *active_edge_local;
  ON_SubDComponentParameter *this_local;
  ON_SubDVertexPtr vptr_local;
  
  this->m_cid = ON_SubDComponentId::Unset;
  local_28 = active_face;
  active_face_local = (ON_SubDFace *)active_edge;
  active_edge_local = (ON_SubDEdge *)this;
  this_local = (ON_SubDComponentParameter *)vptr.m_ptr;
  memset(&this->m_p0,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p0).v_active_e);
  memset(&this->m_p1,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p1).v_active_f);
  v = (ON_SubDVertex *)this_local;
  ON_SubDComponentId::ON_SubDComponentId(&local_30,(ON_SubDVertexPtr)this_local);
  bVar1 = Internal_Init(this,local_30);
  if ((bVar1) &&
     (pOStack_40 = ON_SubDVertexPtr::Vertex((ON_SubDVertexPtr *)&this_local),
     pOStack_40 != (ON_SubDVertex *)0x0)) {
    if (active_face_local != (ON_SubDFace *)0x0) {
      local_44 = ON_SubDVertex::EdgeArrayIndex(pOStack_40,(ON_SubDEdge *)active_face_local);
      OStack_58 = ON_SubDVertex::EdgePtr(pOStack_40,local_44);
      ON_SubDComponentId::ON_SubDComponentId(&local_4c.v_active_e,OStack_58);
      this->m_p0 = local_4c;
    }
    if (local_28 != (ON_SubDFace *)0x0) {
      local_5c = ON_SubDVertex::FaceArrayIndex(pOStack_40,local_28);
      f = ON_SubDVertex::Face(pOStack_40,local_5c);
      ON_SubDComponentId::ON_SubDComponentId(&local_64.v_active_f,f);
      this->m_p1 = local_64;
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDVertexPtr vptr,
  const class ON_SubDEdge* active_edge,
  const class ON_SubDFace* active_face
)
{
  if (Internal_Init(ON_SubDComponentId(vptr)))
  {
    const ON_SubDVertex* v = vptr.Vertex();
    if (nullptr != v)
    {
      if (nullptr != active_edge)
      {
        const int vei = v->EdgeArrayIndex(active_edge);
        m_p0.v_active_e = ON_SubDComponentId(v->EdgePtr(vei));
      }
      if (nullptr != active_face)
      {
        const int vfi = v->FaceArrayIndex(active_face);
        m_p1.v_active_f = ON_SubDComponentId(v->Face(vfi));
      }
    }
  }
}